

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *imgui_ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  value_type pIVar2;
  value_type *ppIVar3;
  ImGuiWindowSettings *pIVar4;
  value_type *pvVar5;
  char *pcVar6;
  int i;
  int iVar7;
  char *__haystack;
  int i_1;
  
  for (iVar7 = 0; iVar7 != (imgui_ctx->Windows).Size; iVar7 = iVar7 + 1) {
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&imgui_ctx->Windows,iVar7);
    pIVar2 = *ppIVar3;
    if ((pIVar2->Flags & 0x100) == 0) {
      pIVar4 = ImGui::FindWindowSettings(pIVar2->ID);
      if (pIVar4 == (ImGuiWindowSettings *)0x0) {
        pIVar4 = AddWindowSettings(pIVar2->Name);
      }
      pIVar4->Pos = pIVar2->Pos;
      pIVar4->Size = pIVar2->SizeFull;
      pIVar4->Collapsed = pIVar2->Collapsed;
    }
  }
  ImVector<char>::reserve(&buf->Buf,(buf->Buf).Size + (imgui_ctx->SettingsWindows).Size * 0x60 + -1)
  ;
  for (iVar7 = 0; iVar7 != (imgui_ctx->SettingsWindows).Size; iVar7 = iVar7 + 1) {
    pvVar5 = ImVector<ImGuiWindowSettings>::operator[](&imgui_ctx->SettingsWindows,iVar7);
    fVar1 = (pvVar5->Pos).x;
    if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
      __haystack = pvVar5->Name;
      pcVar6 = strstr(__haystack,"###");
      if (pcVar6 != (char *)0x0) {
        __haystack = pcVar6;
      }
      ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,__haystack);
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)(pvVar5->Pos).x,
                 (ulong)(uint)(int)(pvVar5->Pos).y);
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)(pvVar5->Size).x,
                 (ulong)(uint)(int)(pvVar5->Size).y);
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pvVar5->Collapsed);
      ImGuiTextBuffer::appendf(buf,"\n");
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* imgui_ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    ImGuiContext& g = *imgui_ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;
        ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID);
        if (!settings)
            settings = AddWindowSettings(window->Name);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write a buffer
    // If a window wasn't opened in this session we preserve its settings
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        buf->appendf("[%s][%s]\n", handler->TypeName, name);
        buf->appendf("Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        buf->appendf("Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}